

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_maxVecScalar_vec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  uint uVar4;
  undefined8 local_28;
  float local_20;
  float local_1c;
  Vector<float,_4> res;
  
  local_28 = *(undefined8 *)(c->in[0].m_data + 1);
  local_20 = c->in[0].m_data[3];
  local_1c = c->in[0].m_data[0];
  fVar1 = c->in[1].m_data[0];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    fVar2 = *(float *)((long)&local_28 + lVar3 * 4);
    uVar4 = -(uint)(fVar1 <= fVar2);
    res.m_data[lVar3] = (float)(~uVar4 & (uint)fVar1 | (uint)fVar2 & uVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *(undefined8 *)(c->color).m_data = res.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }